

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_fmax_a_df_mips64el
               (CPUMIPSState_conflict10 *env,uint32_t df,uint32_t wd,uint32_t ws,uint32_t wt)

{
  float_status *status_00;
  int32_t *piVar1;
  byte bVar2;
  int iVar3;
  float32 fVar4;
  uint uVar5;
  uint uVar6;
  float32 fVar7;
  float32 fVar8;
  uint uVar9;
  float32 fVar10;
  float32 fVar11;
  fpr_t *pfVar12;
  float64 fVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  float32 fVar17;
  fpr_t *pfVar18;
  ulong uVar19;
  uint uVar20;
  float64 b;
  float64 fVar21;
  uint32_t unaff_retaddr;
  float_status *status;
  ulong local_68;
  float64 local_60;
  float64 local_58;
  uint local_50;
  uint local_4c;
  float64 local_48;
  float64 local_40;
  
  status_00 = &(env->active_tc).msa_fp_status;
  pfVar18 = (env->active_fpu).fpr + ws;
  pfVar12 = (env->active_fpu).fpr + wt;
  piVar1 = &(env->active_tc).msacsr;
  *piVar1 = *piVar1 & 0xfffc0fff;
  if (df == 3) {
    uVar19 = pfVar18->fd;
    fVar13 = pfVar12->fd;
    fVar21 = uVar19 & 0x7fffffffffffffff;
    if (((0x7ff0000000000000 < fVar21) ||
        (iVar3 = float64_is_quiet_nan_mips64el(fVar13,status_00), b = uVar19, local_40 = fVar21,
        iVar3 == 0)) &&
       (local_40 = fVar13 & 0x7fffffffffffffff, b = fVar13, local_40 < 0x7ff0000000000001)) {
      iVar3 = float64_is_quiet_nan_mips64el(uVar19,status_00);
      if (iVar3 != 0) {
        uVar19 = fVar13;
      }
      fVar21 = uVar19 & 0x7fffffffffffffff;
    }
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    local_68 = float64_max_mips64el(uVar19,b,status_00);
    bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
    uVar14 = ieee_ex_to_mips_mips64el((uint)bVar2);
    uVar15 = (env->active_tc).msacsr;
    uVar20 = (uint)(byte)((byte)((uVar15 & 0x1000000) >> 0x18) & bVar2 >> 6);
    uVar16 = 3;
    if ((uVar15 & 0x1000000) == 0) {
      uVar16 = uVar20;
    }
    if (-1 < (char)bVar2) {
      uVar16 = uVar20;
    }
    uVar16 = uVar16 | uVar14;
    uVar5 = (uint)((uVar15 >> 9 & 1) == 0 & (byte)uVar14 >> 2);
    uVar20 = uVar5 | uVar16;
    uVar14 = uVar14 & 0xfffffffc;
    if ((uVar5 != 0 || (uVar16 & 1) != 0) || (uVar15 & 0x100) != 0) {
      uVar14 = uVar20;
    }
    if ((uVar16 & 2) == 0) {
      uVar14 = uVar20;
    }
    if ((uVar14 & (uVar15 >> 7 & 0x1f | 0x20)) == 0) {
      uVar16 = uVar14 << 0xc;
LAB_009713de:
      (env->active_tc).msacsr = uVar16 & 0x3f000 | uVar15;
      if (((uVar15 >> 7 & 0x1f | 0x20) & uVar14) != 0) goto LAB_009713f9;
    }
    else {
      if ((uVar15 >> 0x12 & 1) == 0) {
        uVar16 = uVar14 << 0xc | uVar15;
        uVar15 = uVar15 & 0xfff80fff;
        goto LAB_009713de;
      }
LAB_009713f9:
      fVar13 = float64_default_nan_mips64el(status_00);
      local_68 = (long)(int)uVar14 | fVar13 & 0xffffffffffffffc0 ^ 0x8000000000000;
    }
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    local_60 = float64_min_mips64el(uVar19,b,status_00);
    bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
    uVar14 = ieee_ex_to_mips_mips64el((uint)bVar2);
    uVar15 = (env->active_tc).msacsr;
    uVar20 = (uint)(byte)((byte)((uVar15 & 0x1000000) >> 0x18) & bVar2 >> 6);
    uVar16 = 3;
    if ((uVar15 & 0x1000000) == 0) {
      uVar16 = uVar20;
    }
    if (-1 < (char)bVar2) {
      uVar16 = uVar20;
    }
    uVar16 = uVar16 | uVar14;
    uVar5 = (uint)((uVar15 >> 9 & 1) == 0 & (byte)uVar14 >> 2);
    uVar20 = uVar5 | uVar16;
    uVar14 = uVar14 & 0xfffffffc;
    if ((uVar5 != 0 || (uVar16 & 1) != 0) || (uVar15 & 0x100) != 0) {
      uVar14 = uVar20;
    }
    if ((uVar16 & 2) == 0) {
      uVar14 = uVar20;
    }
    if ((uVar14 & (uVar15 >> 7 & 0x1f | 0x20)) == 0) {
      uVar16 = uVar14 << 0xc;
LAB_00971529:
      (env->active_tc).msacsr = uVar16 & 0x3f000 | uVar15;
      if (((uVar15 >> 7 & 0x1f | 0x20) & uVar14) != 0) goto LAB_00971543;
    }
    else {
      if ((uVar15 >> 0x12 & 1) == 0) {
        uVar16 = uVar14 << 0xc | uVar15;
        uVar15 = uVar15 & 0xfff80fff;
        goto LAB_00971529;
      }
LAB_00971543:
      fVar13 = float64_default_nan_mips64el(status_00);
      local_60 = (long)(int)uVar14 | fVar13 & 0xffffffffffffffc0 ^ 0x8000000000000;
    }
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    fVar13 = float64_max_mips64el(fVar21,local_40,status_00);
    bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
    uVar14 = ieee_ex_to_mips_mips64el((uint)bVar2);
    uVar15 = (env->active_tc).msacsr;
    uVar20 = (uint)(byte)((byte)((uVar15 & 0x1000000) >> 0x18) & bVar2 >> 6);
    uVar16 = 3;
    if ((uVar15 & 0x1000000) == 0) {
      uVar16 = uVar20;
    }
    if (-1 < (char)bVar2) {
      uVar16 = uVar20;
    }
    uVar16 = uVar16 | uVar14;
    uVar5 = (uint)((uVar15 >> 9 & 1) == 0 & (byte)uVar14 >> 2);
    uVar20 = uVar5 | uVar16;
    uVar14 = uVar14 & 0xfffffffc;
    if ((uVar5 != 0 || (uVar16 & 1) != 0) || (uVar15 & 0x100) != 0) {
      uVar14 = uVar20;
    }
    if ((uVar16 & 2) == 0) {
      uVar14 = uVar20;
    }
    if ((uVar14 & (uVar15 >> 7 & 0x1f | 0x20)) == 0) {
      uVar16 = uVar14 << 0xc;
LAB_00971646:
      (env->active_tc).msacsr = uVar16 & 0x3f000 | uVar15;
      if (((uVar15 >> 7 & 0x1f | 0x20) & uVar14) != 0) goto LAB_00971660;
    }
    else {
      if ((uVar15 >> 0x12 & 1) == 0) {
        uVar16 = uVar14 << 0xc | uVar15;
        uVar15 = uVar15 & 0xfff80fff;
        goto LAB_00971646;
      }
LAB_00971660:
      fVar13 = float64_default_nan_mips64el(status_00);
      fVar13 = (long)(int)uVar14 | fVar13 & 0xffffffffffffffc0 ^ 0x8000000000000;
    }
    if (fVar13 == (local_68 & 0x7fffffffffffffff)) {
      local_60 = local_68;
    }
    if (fVar21 == local_40) {
      local_60 = local_68;
    }
    uVar19 = *(ulong *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
    fVar13 = *(float64 *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
    local_58 = uVar19 & 0x7fffffffffffffff;
    if (((0x7ff0000000000000 < local_58) ||
        (iVar3 = float64_is_quiet_nan_mips64el(fVar13,status_00), fVar21 = uVar19,
        local_48 = local_58, iVar3 == 0)) &&
       (local_48 = fVar13 & 0x7fffffffffffffff, fVar21 = fVar13, local_48 < 0x7ff0000000000001)) {
      iVar3 = float64_is_quiet_nan_mips64el(uVar19,status_00);
      if (iVar3 != 0) {
        uVar19 = fVar13;
      }
      local_58 = uVar19 & 0x7fffffffffffffff;
    }
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    fVar13 = float64_max_mips64el(uVar19,fVar21,status_00);
    bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
    uVar14 = ieee_ex_to_mips_mips64el((uint)bVar2);
    uVar15 = (env->active_tc).msacsr;
    uVar20 = (uint)(byte)((byte)((uVar15 & 0x1000000) >> 0x18) & bVar2 >> 6);
    uVar16 = 3;
    if ((uVar15 & 0x1000000) == 0) {
      uVar16 = uVar20;
    }
    if (-1 < (char)bVar2) {
      uVar16 = uVar20;
    }
    uVar16 = uVar16 | uVar14;
    uVar5 = (uint)((uVar15 >> 9 & 1) == 0 & (byte)uVar14 >> 2);
    uVar20 = uVar5 | uVar16;
    uVar14 = uVar14 & 0xfffffffc;
    if ((uVar5 != 0 || (uVar16 & 1) != 0) || (uVar15 & 0x100) != 0) {
      uVar14 = uVar20;
    }
    if ((uVar16 & 2) == 0) {
      uVar14 = uVar20;
    }
    if ((uVar14 & (uVar15 >> 7 & 0x1f | 0x20)) == 0) {
      uVar16 = uVar14 << 0xc;
LAB_009717ec:
      (env->active_tc).msacsr = uVar16 & 0x3f000 | uVar15;
      if (((uVar15 >> 7 & 0x1f | 0x20) & uVar14) != 0) goto LAB_00971807;
    }
    else {
      if ((uVar15 >> 0x12 & 1) == 0) {
        uVar16 = uVar14 << 0xc | uVar15;
        uVar15 = uVar15 & 0xfff80fff;
        goto LAB_009717ec;
      }
LAB_00971807:
      fVar13 = float64_default_nan_mips64el(status_00);
      fVar13 = (long)(int)uVar14 | fVar13 & 0xffffffffffffffc0 ^ 0x8000000000000;
    }
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    local_40 = float64_min_mips64el(uVar19,fVar21,status_00);
    bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
    uVar14 = ieee_ex_to_mips_mips64el((uint)bVar2);
    uVar15 = (env->active_tc).msacsr;
    uVar20 = (uint)(byte)((byte)((uVar15 & 0x1000000) >> 0x18) & bVar2 >> 6);
    uVar16 = 3;
    if ((uVar15 & 0x1000000) == 0) {
      uVar16 = uVar20;
    }
    if (-1 < (char)bVar2) {
      uVar16 = uVar20;
    }
    uVar16 = uVar16 | uVar14;
    uVar5 = (uint)((uVar15 >> 9 & 1) == 0 & (byte)uVar14 >> 2);
    uVar20 = uVar5 | uVar16;
    uVar14 = uVar14 & 0xfffffffc;
    if ((uVar5 != 0 || (uVar16 & 1) != 0) || (uVar15 & 0x100) != 0) {
      uVar14 = uVar20;
    }
    if ((uVar16 & 2) == 0) {
      uVar14 = uVar20;
    }
    if ((uVar14 & (uVar15 >> 7 & 0x1f | 0x20)) == 0) {
      uVar16 = uVar14 << 0xc;
LAB_009718f1:
      (env->active_tc).msacsr = uVar16 & 0x3f000 | uVar15;
      if (((uVar15 >> 7 & 0x1f | 0x20) & uVar14) != 0) goto LAB_0097190c;
    }
    else {
      if ((uVar15 >> 0x12 & 1) == 0) {
        uVar16 = uVar14 << 0xc | uVar15;
        uVar15 = uVar15 & 0xfff80fff;
        goto LAB_009718f1;
      }
LAB_0097190c:
      fVar21 = float64_default_nan_mips64el(status_00);
      local_40 = (long)(int)uVar14 | fVar21 & 0xffffffffffffffc0 ^ 0x8000000000000;
    }
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    fVar21 = float64_max_mips64el(local_58,local_48,status_00);
    bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
    uVar14 = ieee_ex_to_mips_mips64el((uint)bVar2);
    uVar15 = (env->active_tc).msacsr;
    uVar20 = (uint)(byte)((byte)((uVar15 & 0x1000000) >> 0x18) & bVar2 >> 6);
    uVar16 = 3;
    if ((uVar15 & 0x1000000) == 0) {
      uVar16 = uVar20;
    }
    if (-1 < (char)bVar2) {
      uVar16 = uVar20;
    }
    uVar16 = uVar16 | uVar14;
    uVar5 = (uint)((uVar15 >> 9 & 1) == 0 & (byte)uVar14 >> 2);
    uVar20 = uVar5 | uVar16;
    uVar14 = uVar14 & 0xfffffffc;
    if ((uVar5 != 0 || (uVar16 & 1) != 0) || (uVar15 & 0x100) != 0) {
      uVar14 = uVar20;
    }
    if ((uVar16 & 2) == 0) {
      uVar14 = uVar20;
    }
    if ((uVar14 & (uVar15 >> 7 & 0x1f | 0x20)) == 0) {
      uVar16 = uVar14 << 0xc;
LAB_00971a0e:
      (env->active_tc).msacsr = uVar16 & 0x3f000 | uVar15;
      if (((uVar15 >> 7 & 0x1f | 0x20) & uVar14) != 0) goto LAB_00971a29;
    }
    else {
      if ((uVar15 >> 0x12 & 1) == 0) {
        uVar16 = uVar14 << 0xc | uVar15;
        uVar15 = uVar15 & 0xfff80fff;
        goto LAB_00971a0e;
      }
LAB_00971a29:
      fVar21 = float64_default_nan_mips64el(status_00);
      fVar21 = (long)(int)uVar14 | fVar21 & 0xffffffffffffffc0 ^ 0x8000000000000;
    }
    if ((local_58 != local_48) && (fVar21 != (fVar13 & 0x7fffffffffffffff))) {
      fVar13 = local_40;
    }
    goto LAB_0097271a;
  }
  if (df != 2) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                  ,0x1ada,
                  "void helper_msa_fmax_a_df_mips64el(CPUMIPSState *, uint32_t, uint32_t, uint32_t, uint32_t)"
                 );
  }
  uVar15 = pfVar18->fs[0];
  fVar4 = pfVar12->fs[0];
  uVar16 = uVar15 & 0x7fffffff;
  if (((0x7f800000 < (uVar15 & 0x7fffffff)) ||
      (iVar3 = float32_is_quiet_nan_mips64el(fVar4,status_00), fVar7 = uVar15,
      local_68._0_4_ = uVar16, iVar3 == 0)) &&
     (local_68._0_4_ = fVar4 & 0x7fffffff, fVar7 = fVar4, (fVar4 & 0x7fffffff) < 0x7f800001)) {
    iVar3 = float32_is_quiet_nan_mips64el(uVar15,status_00);
    if (iVar3 != 0) {
      uVar15 = fVar4;
    }
    uVar16 = uVar15 & 0x7fffffff;
  }
  (env->active_tc).msa_fp_status.float_exception_flags = '\0';
  fVar4 = float32_max_mips64el(uVar15,fVar7,status_00);
  bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
  uVar5 = ieee_ex_to_mips_mips64el((uint)bVar2);
  uVar14 = (env->active_tc).msacsr;
  uVar9 = (uint)(byte)((byte)((uVar14 & 0x1000000) >> 0x18) & bVar2 >> 6);
  uVar20 = 3;
  if ((uVar14 & 0x1000000) == 0) {
    uVar20 = uVar9;
  }
  if (-1 < (char)bVar2) {
    uVar20 = uVar9;
  }
  uVar20 = uVar20 | uVar5;
  uVar9 = (uint)((uVar14 >> 9 & 1) == 0 & (byte)uVar5 >> 2);
  uVar6 = uVar9 | uVar20;
  uVar5 = uVar5 & 0xfffffffc;
  if ((uVar9 != 0 || (uVar20 & 1) != 0) || (uVar14 & 0x100) != 0) {
    uVar5 = uVar6;
  }
  if ((uVar20 & 2) == 0) {
    uVar5 = uVar6;
  }
  if ((uVar5 & (uVar14 >> 7 & 0x1f | 0x20)) == 0) {
    uVar20 = uVar5 << 0xc;
LAB_0097142a:
    (env->active_tc).msacsr = uVar20 & 0x3f000 | uVar14;
    if (((uVar14 >> 7 & 0x1f | 0x20) & uVar5) != 0) goto LAB_00971449;
  }
  else {
    if ((uVar14 >> 0x12 & 1) == 0) {
      uVar20 = uVar5 << 0xc | uVar14;
      uVar14 = uVar14 & 0xfff80fff;
      goto LAB_0097142a;
    }
LAB_00971449:
    fVar4 = float32_default_nan_mips64el(status_00);
    fVar4 = fVar4 & 0xffffffc0 ^ 0x400000 | uVar5;
  }
  (env->active_tc).msa_fp_status.float_exception_flags = '\0';
  fVar7 = float32_min_mips64el(uVar15,fVar7,status_00);
  bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
  uVar20 = ieee_ex_to_mips_mips64el((uint)bVar2);
  uVar15 = (env->active_tc).msacsr;
  uVar5 = (uint)(byte)((byte)((uVar15 & 0x1000000) >> 0x18) & bVar2 >> 6);
  uVar14 = 3;
  if ((uVar15 & 0x1000000) == 0) {
    uVar14 = uVar5;
  }
  if (-1 < (char)bVar2) {
    uVar14 = uVar5;
  }
  uVar14 = uVar14 | uVar20;
  uVar9 = (uint)((uVar15 >> 9 & 1) == 0 & (byte)uVar20 >> 2);
  uVar5 = uVar9 | uVar14;
  uVar20 = uVar20 & 0xfffffffc;
  if ((uVar9 != 0 || (uVar14 & 1) != 0) || (uVar15 & 0x100) != 0) {
    uVar20 = uVar5;
  }
  if ((uVar14 & 2) == 0) {
    uVar20 = uVar5;
  }
  if ((uVar20 & (uVar15 >> 7 & 0x1f | 0x20)) == 0) {
    uVar14 = uVar20 << 0xc;
LAB_00971b31:
    (env->active_tc).msacsr = uVar14 & 0x3f000 | uVar15;
    if (((uVar15 >> 7 & 0x1f | 0x20) & uVar20) != 0) goto LAB_00971b4b;
  }
  else {
    if ((uVar15 >> 0x12 & 1) == 0) {
      uVar14 = uVar20 << 0xc | uVar15;
      uVar15 = uVar15 & 0xfff80fff;
      goto LAB_00971b31;
    }
LAB_00971b4b:
    fVar7 = float32_default_nan_mips64el(status_00);
    fVar7 = fVar7 & 0xffffffc0 ^ 0x400000 | uVar20;
  }
  (env->active_tc).msa_fp_status.float_exception_flags = '\0';
  fVar8 = float32_max_mips64el(uVar16,(uint)local_68,status_00);
  bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
  uVar20 = ieee_ex_to_mips_mips64el((uint)bVar2);
  uVar15 = (env->active_tc).msacsr;
  uVar5 = (uint)(byte)((byte)((uVar15 & 0x1000000) >> 0x18) & bVar2 >> 6);
  uVar14 = 3;
  if ((uVar15 & 0x1000000) == 0) {
    uVar14 = uVar5;
  }
  if (-1 < (char)bVar2) {
    uVar14 = uVar5;
  }
  uVar14 = uVar14 | uVar20;
  uVar5 = (uint)((uVar15 >> 9 & 1) == 0 & (byte)uVar20 >> 2);
  uVar9 = uVar5 | uVar14;
  uVar20 = uVar20 & 0xfffffffc;
  if ((uVar5 != 0 || (uVar14 & 1) != 0) || (uVar15 & 0x100) != 0) {
    uVar20 = uVar9;
  }
  if ((uVar14 & 2) == 0) {
    uVar20 = uVar9;
  }
  if ((uVar20 & (uVar15 >> 7 & 0x1f | 0x20)) == 0) {
    uVar14 = uVar20 << 0xc;
LAB_00971c1c:
    (env->active_tc).msacsr = uVar14 & 0x3f000 | uVar15;
    if (((uVar15 >> 7 & 0x1f | 0x20) & uVar20) != 0) goto LAB_00971c36;
  }
  else {
    if ((uVar15 >> 0x12 & 1) == 0) {
      uVar14 = uVar20 << 0xc | uVar15;
      uVar15 = uVar15 & 0xfff80fff;
      goto LAB_00971c1c;
    }
LAB_00971c36:
    fVar8 = float32_default_nan_mips64el(status_00);
    fVar8 = fVar8 & 0xffffffc0 ^ 0x400000 | uVar20;
  }
  if (fVar8 == (fVar4 & 0x7fffffff)) {
    fVar7 = fVar4;
  }
  if (uVar16 == (uint)local_68) {
    fVar7 = fVar4;
  }
  uVar15 = *(uint *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 4);
  fVar4 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 4);
  fVar8 = uVar15 & 0x7fffffff;
  if (((0x7f800000 < fVar8) ||
      (iVar3 = float32_is_quiet_nan_mips64el(fVar4,status_00), fVar10 = uVar15,
      local_68._0_4_ = fVar8, iVar3 == 0)) &&
     (local_68._0_4_ = fVar4 & 0x7fffffff, fVar10 = fVar4, (uint)local_68 < 0x7f800001)) {
    iVar3 = float32_is_quiet_nan_mips64el(uVar15,status_00);
    if (iVar3 != 0) {
      uVar15 = fVar4;
    }
    fVar8 = uVar15 & 0x7fffffff;
  }
  (env->active_tc).msa_fp_status.float_exception_flags = '\0';
  local_4c = float32_max_mips64el(uVar15,fVar10,status_00);
  bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
  uVar20 = ieee_ex_to_mips_mips64el((uint)bVar2);
  uVar16 = (env->active_tc).msacsr;
  uVar5 = (uint)(byte)((byte)((uVar16 & 0x1000000) >> 0x18) & bVar2 >> 6);
  uVar14 = 3;
  if ((uVar16 & 0x1000000) == 0) {
    uVar14 = uVar5;
  }
  if (-1 < (char)bVar2) {
    uVar14 = uVar5;
  }
  uVar14 = uVar14 | uVar20;
  uVar5 = (uint)((uVar16 >> 9 & 1) == 0 & (byte)uVar20 >> 2);
  uVar9 = uVar5 | uVar14;
  uVar20 = uVar20 & 0xfffffffc;
  if ((uVar5 != 0 || (uVar14 & 1) != 0) || (uVar16 & 0x100) != 0) {
    uVar20 = uVar9;
  }
  if ((uVar14 & 2) == 0) {
    uVar20 = uVar9;
  }
  if ((uVar20 & (uVar16 >> 7 & 0x1f | 0x20)) == 0) {
    uVar14 = uVar20 << 0xc;
LAB_00971da3:
    (env->active_tc).msacsr = uVar14 & 0x3f000 | uVar16;
    if (((uVar16 >> 7 & 0x1f | 0x20) & uVar20) != 0) goto LAB_00971dbe;
  }
  else {
    if ((uVar16 >> 0x12 & 1) == 0) {
      uVar14 = uVar20 << 0xc | uVar16;
      uVar16 = uVar16 & 0xfff80fff;
      goto LAB_00971da3;
    }
LAB_00971dbe:
    fVar4 = float32_default_nan_mips64el(status_00);
    local_4c = fVar4 & 0xffffffc0 ^ 0x400000 | uVar20;
  }
  (env->active_tc).msa_fp_status.float_exception_flags = '\0';
  fVar4 = float32_min_mips64el(uVar15,fVar10,status_00);
  bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
  uVar14 = ieee_ex_to_mips_mips64el((uint)bVar2);
  uVar15 = (env->active_tc).msacsr;
  uVar20 = (uint)(byte)((byte)((uVar15 & 0x1000000) >> 0x18) & bVar2 >> 6);
  uVar16 = 3;
  if ((uVar15 & 0x1000000) == 0) {
    uVar16 = uVar20;
  }
  if (-1 < (char)bVar2) {
    uVar16 = uVar20;
  }
  uVar16 = uVar16 | uVar14;
  uVar20 = (uint)((uVar15 >> 9 & 1) == 0 & (byte)uVar14 >> 2);
  uVar5 = uVar20 | uVar16;
  uVar14 = uVar14 & 0xfffffffc;
  if ((uVar20 != 0 || (uVar16 & 1) != 0) || (uVar15 & 0x100) != 0) {
    uVar14 = uVar5;
  }
  if ((uVar16 & 2) == 0) {
    uVar14 = uVar5;
  }
  if ((uVar14 & (uVar15 >> 7 & 0x1f | 0x20)) == 0) {
    uVar16 = uVar14 << 0xc;
LAB_00971eac:
    (env->active_tc).msacsr = uVar16 & 0x3f000 | uVar15;
    if (((uVar15 >> 7 & 0x1f | 0x20) & uVar14) != 0) goto LAB_00971ec7;
  }
  else {
    if ((uVar15 >> 0x12 & 1) == 0) {
      uVar16 = uVar14 << 0xc | uVar15;
      uVar15 = uVar15 & 0xfff80fff;
      goto LAB_00971eac;
    }
LAB_00971ec7:
    fVar4 = float32_default_nan_mips64el(status_00);
    fVar4 = fVar4 & 0xffffffc0 ^ 0x400000 | uVar14;
  }
  (env->active_tc).msa_fp_status.float_exception_flags = '\0';
  fVar10 = float32_max_mips64el(fVar8,(uint)local_68,status_00);
  bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
  uVar14 = ieee_ex_to_mips_mips64el((uint)bVar2);
  uVar15 = (env->active_tc).msacsr;
  uVar20 = (uint)(byte)((byte)((uVar15 & 0x1000000) >> 0x18) & bVar2 >> 6);
  uVar16 = 3;
  if ((uVar15 & 0x1000000) == 0) {
    uVar16 = uVar20;
  }
  if (-1 < (char)bVar2) {
    uVar16 = uVar20;
  }
  uVar16 = uVar16 | uVar14;
  uVar5 = (uint)((uVar15 >> 9 & 1) == 0 & (byte)uVar14 >> 2);
  uVar20 = uVar5 | uVar16;
  uVar14 = uVar14 & 0xfffffffc;
  if ((uVar5 != 0 || (uVar16 & 1) != 0) || (uVar15 & 0x100) != 0) {
    uVar14 = uVar20;
  }
  if ((uVar16 & 2) == 0) {
    uVar14 = uVar20;
  }
  if ((uVar14 & (uVar15 >> 7 & 0x1f | 0x20)) == 0) {
    uVar16 = uVar14 << 0xc;
LAB_00971f9c:
    (env->active_tc).msacsr = uVar16 & 0x3f000 | uVar15;
    if (((uVar15 >> 7 & 0x1f | 0x20) & uVar14) != 0) goto LAB_00971fb7;
  }
  else {
    if ((uVar15 >> 0x12 & 1) == 0) {
      uVar16 = uVar14 << 0xc | uVar15;
      uVar15 = uVar15 & 0xfff80fff;
      goto LAB_00971f9c;
    }
LAB_00971fb7:
    fVar10 = float32_default_nan_mips64el(status_00);
    fVar10 = fVar10 & 0xffffffc0 ^ 0x400000 | uVar14;
  }
  if (fVar10 == (local_4c & 0x7fffffff)) {
    fVar4 = local_4c;
  }
  if (fVar8 == (uint)local_68) {
    fVar4 = local_4c;
  }
  fVar8 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
  fVar10 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
  fVar17 = fVar8 & 0x7fffffff;
  if (((0x7f800000 < fVar17) ||
      (iVar3 = float32_is_quiet_nan_mips64el(fVar10,status_00), fVar11 = fVar8, local_4c = fVar17,
      iVar3 == 0)) && (local_4c = fVar10 & 0x7fffffff, fVar11 = fVar10, local_4c < 0x7f800001)) {
    iVar3 = float32_is_quiet_nan_mips64el(fVar8,status_00);
    if (iVar3 != 0) {
      fVar8 = fVar10;
    }
    fVar17 = fVar8 & 0x7fffffff;
  }
  (env->active_tc).msa_fp_status.float_exception_flags = '\0';
  local_50 = float32_max_mips64el(fVar8,fVar11,status_00);
  bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
  uVar14 = ieee_ex_to_mips_mips64el((uint)bVar2);
  uVar15 = (env->active_tc).msacsr;
  uVar20 = (uint)(byte)((byte)((uVar15 & 0x1000000) >> 0x18) & bVar2 >> 6);
  uVar16 = 3;
  if ((uVar15 & 0x1000000) == 0) {
    uVar16 = uVar20;
  }
  if (-1 < (char)bVar2) {
    uVar16 = uVar20;
  }
  uVar16 = uVar16 | uVar14;
  uVar20 = (uint)((uVar15 >> 9 & 1) == 0 & (byte)uVar14 >> 2);
  uVar5 = uVar20 | uVar16;
  uVar14 = uVar14 & 0xfffffffc;
  if ((uVar20 != 0 || (uVar16 & 1) != 0) || (uVar15 & 0x100) != 0) {
    uVar14 = uVar5;
  }
  if ((uVar16 & 2) == 0) {
    uVar14 = uVar5;
  }
  if ((uVar14 & (uVar15 >> 7 & 0x1f | 0x20)) == 0) {
    uVar16 = uVar14 << 0xc;
LAB_0097212e:
    (env->active_tc).msacsr = uVar16 & 0x3f000 | uVar15;
    if (((uVar15 >> 7 & 0x1f | 0x20) & uVar14) != 0) goto LAB_00972149;
  }
  else {
    if ((uVar15 >> 0x12 & 1) == 0) {
      uVar16 = uVar14 << 0xc | uVar15;
      uVar15 = uVar15 & 0xfff80fff;
      goto LAB_0097212e;
    }
LAB_00972149:
    fVar10 = float32_default_nan_mips64el(status_00);
    local_50 = fVar10 & 0xffffffc0 ^ 0x400000 | uVar14;
  }
  (env->active_tc).msa_fp_status.float_exception_flags = '\0';
  fVar8 = float32_min_mips64el(fVar8,fVar11,status_00);
  bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
  uVar14 = ieee_ex_to_mips_mips64el((uint)bVar2);
  uVar15 = (env->active_tc).msacsr;
  uVar20 = (uint)(byte)((byte)((uVar15 & 0x1000000) >> 0x18) & bVar2 >> 6);
  uVar16 = 3;
  if ((uVar15 & 0x1000000) == 0) {
    uVar16 = uVar20;
  }
  if (-1 < (char)bVar2) {
    uVar16 = uVar20;
  }
  uVar16 = uVar16 | uVar14;
  uVar5 = (uint)((uVar15 >> 9 & 1) == 0 & (byte)uVar14 >> 2);
  uVar20 = uVar5 | uVar16;
  uVar14 = uVar14 & 0xfffffffc;
  if ((uVar5 != 0 || (uVar16 & 1) != 0) || (uVar15 & 0x100) != 0) {
    uVar14 = uVar20;
  }
  if ((uVar16 & 2) == 0) {
    uVar14 = uVar20;
  }
  if ((uVar14 & (uVar15 >> 7 & 0x1f | 0x20)) == 0) {
    uVar16 = uVar14 << 0xc;
LAB_0097222f:
    (env->active_tc).msacsr = uVar16 & 0x3f000 | uVar15;
    if (((uVar15 >> 7 & 0x1f | 0x20) & uVar14) != 0) goto LAB_0097224a;
  }
  else {
    if ((uVar15 >> 0x12 & 1) == 0) {
      uVar16 = uVar14 << 0xc | uVar15;
      uVar15 = uVar15 & 0xfff80fff;
      goto LAB_0097222f;
    }
LAB_0097224a:
    fVar8 = float32_default_nan_mips64el(status_00);
    fVar8 = fVar8 & 0xffffffc0 ^ 0x400000 | uVar14;
  }
  (env->active_tc).msa_fp_status.float_exception_flags = '\0';
  fVar10 = float32_max_mips64el(fVar17,local_4c,status_00);
  bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
  uVar14 = ieee_ex_to_mips_mips64el((uint)bVar2);
  uVar15 = (env->active_tc).msacsr;
  uVar20 = (uint)(byte)((byte)((uVar15 & 0x1000000) >> 0x18) & bVar2 >> 6);
  uVar16 = 3;
  if ((uVar15 & 0x1000000) == 0) {
    uVar16 = uVar20;
  }
  if (-1 < (char)bVar2) {
    uVar16 = uVar20;
  }
  uVar16 = uVar16 | uVar14;
  uVar20 = (uint)((uVar15 >> 9 & 1) == 0 & (byte)uVar14 >> 2);
  uVar5 = uVar20 | uVar16;
  uVar14 = uVar14 & 0xfffffffc;
  if ((uVar20 != 0 || (uVar16 & 1) != 0) || (uVar15 & 0x100) != 0) {
    uVar14 = uVar5;
  }
  if ((uVar16 & 2) == 0) {
    uVar14 = uVar5;
  }
  if ((uVar14 & (uVar15 >> 7 & 0x1f | 0x20)) == 0) {
    uVar16 = uVar14 << 0xc;
LAB_0097232c:
    (env->active_tc).msacsr = uVar16 & 0x3f000 | uVar15;
    if (((uVar15 >> 7 & 0x1f | 0x20) & uVar14) != 0) goto LAB_00972347;
  }
  else {
    if ((uVar15 >> 0x12 & 1) == 0) {
      uVar16 = uVar14 << 0xc | uVar15;
      uVar15 = uVar15 & 0xfff80fff;
      goto LAB_0097232c;
    }
LAB_00972347:
    fVar10 = float32_default_nan_mips64el(status_00);
    fVar10 = fVar10 & 0xffffffc0 ^ 0x400000 | uVar14;
  }
  if (fVar10 == (local_50 & 0x7fffffff)) {
    fVar8 = local_50;
  }
  if (fVar17 == local_4c) {
    fVar8 = local_50;
  }
  fVar10 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xc);
  fVar17 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xc);
  uVar15 = fVar10 & 0x7fffffff;
  if (((0x7f800000 < (fVar10 & 0x7fffffff)) ||
      (iVar3 = float32_is_quiet_nan_mips64el(fVar17,status_00), fVar11 = fVar10,
      local_48._0_4_ = uVar15, iVar3 == 0)) &&
     (fVar11 = fVar17, local_48._0_4_ = fVar17 & 0x7fffffff, (fVar17 & 0x7fffffff) < 0x7f800001)) {
    iVar3 = float32_is_quiet_nan_mips64el(fVar10,status_00);
    if (iVar3 != 0) {
      fVar10 = fVar17;
    }
    uVar15 = fVar10 & 0x7fffffff;
  }
  (env->active_tc).msa_fp_status.float_exception_flags = '\0';
  fVar17 = float32_max_mips64el(fVar10,fVar11,status_00);
  bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
  uVar20 = ieee_ex_to_mips_mips64el((uint)bVar2);
  uVar16 = (env->active_tc).msacsr;
  uVar5 = (uint)(byte)((byte)((uVar16 & 0x1000000) >> 0x18) & bVar2 >> 6);
  uVar14 = 3;
  if ((uVar16 & 0x1000000) == 0) {
    uVar14 = uVar5;
  }
  if (-1 < (char)bVar2) {
    uVar14 = uVar5;
  }
  uVar14 = uVar14 | uVar20;
  uVar5 = (uint)((uVar16 >> 9 & 1) == 0 & (byte)uVar20 >> 2);
  uVar9 = uVar5 | uVar14;
  uVar20 = uVar20 & 0xfffffffc;
  if ((uVar5 != 0 || (uVar14 & 1) != 0) || (uVar16 & 0x100) != 0) {
    uVar20 = uVar9;
  }
  if ((uVar14 & 2) == 0) {
    uVar20 = uVar9;
  }
  if ((uVar20 & (uVar16 >> 7 & 0x1f | 0x20)) == 0) {
    uVar14 = uVar20 << 0xc;
LAB_009724b9:
    (env->active_tc).msacsr = uVar14 & 0x3f000 | uVar16;
    if (((uVar16 >> 7 & 0x1f | 0x20) & uVar20) != 0) goto LAB_009724d4;
  }
  else {
    if ((uVar16 >> 0x12 & 1) == 0) {
      uVar14 = uVar20 << 0xc | uVar16;
      uVar16 = uVar16 & 0xfff80fff;
      goto LAB_009724b9;
    }
LAB_009724d4:
    fVar17 = float32_default_nan_mips64el(status_00);
    fVar17 = fVar17 & 0xffffffc0 ^ 0x400000 | uVar20;
  }
  (env->active_tc).msa_fp_status.float_exception_flags = '\0';
  fVar10 = float32_min_mips64el(fVar10,fVar11,status_00);
  bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
  uVar20 = ieee_ex_to_mips_mips64el((uint)bVar2);
  uVar16 = (env->active_tc).msacsr;
  uVar5 = (uint)(byte)((byte)((uVar16 & 0x1000000) >> 0x18) & bVar2 >> 6);
  uVar14 = 3;
  if ((uVar16 & 0x1000000) == 0) {
    uVar14 = uVar5;
  }
  if (-1 < (char)bVar2) {
    uVar14 = uVar5;
  }
  uVar14 = uVar14 | uVar20;
  uVar5 = (uint)((uVar16 >> 9 & 1) == 0 & (byte)uVar20 >> 2);
  uVar9 = uVar5 | uVar14;
  uVar20 = uVar20 & 0xfffffffc;
  if ((uVar5 != 0 || (uVar14 & 1) != 0) || (uVar16 & 0x100) != 0) {
    uVar20 = uVar9;
  }
  if ((uVar14 & 2) == 0) {
    uVar20 = uVar9;
  }
  if ((uVar20 & (uVar16 >> 7 & 0x1f | 0x20)) == 0) {
    uVar14 = uVar20 << 0xc;
LAB_009725b4:
    (env->active_tc).msacsr = uVar14 & 0x3f000 | uVar16;
    if (((uVar16 >> 7 & 0x1f | 0x20) & uVar20) != 0) goto LAB_009725cf;
  }
  else {
    if ((uVar16 >> 0x12 & 1) == 0) {
      uVar14 = uVar20 << 0xc | uVar16;
      uVar16 = uVar16 & 0xfff80fff;
      goto LAB_009725b4;
    }
LAB_009725cf:
    fVar10 = float32_default_nan_mips64el(status_00);
    fVar10 = fVar10 & 0xffffffc0 ^ 0x400000 | uVar20;
  }
  (env->active_tc).msa_fp_status.float_exception_flags = '\0';
  fVar11 = float32_max_mips64el(uVar15,(uint)local_48,status_00);
  bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
  uVar20 = ieee_ex_to_mips_mips64el((uint)bVar2);
  uVar16 = (env->active_tc).msacsr;
  uVar5 = (uint)(byte)((byte)((uVar16 & 0x1000000) >> 0x18) & bVar2 >> 6);
  uVar14 = 3;
  if ((uVar16 & 0x1000000) == 0) {
    uVar14 = uVar5;
  }
  if (-1 < (char)bVar2) {
    uVar14 = uVar5;
  }
  uVar14 = uVar14 | uVar20;
  uVar5 = (uint)((uVar16 >> 9 & 1) == 0 & (byte)uVar20 >> 2);
  uVar9 = uVar5 | uVar14;
  uVar20 = uVar20 & 0xfffffffc;
  if ((uVar5 != 0 || (uVar14 & 1) != 0) || (uVar16 & 0x100) != 0) {
    uVar20 = uVar9;
  }
  if ((uVar14 & 2) == 0) {
    uVar20 = uVar9;
  }
  if ((uVar20 & (uVar16 >> 7 & 0x1f | 0x20)) == 0) {
    uVar14 = uVar20 << 0xc;
LAB_009726c0:
    (env->active_tc).msacsr = uVar14 & 0x3f000 | uVar16;
    if (((uVar16 >> 7 & 0x1f | 0x20) & uVar20) != 0) goto LAB_009726db;
  }
  else {
    if ((uVar16 >> 0x12 & 1) == 0) {
      uVar14 = uVar20 << 0xc | uVar16;
      uVar16 = uVar16 & 0xfff80fff;
      goto LAB_009726c0;
    }
LAB_009726db:
    fVar11 = float32_default_nan_mips64el(status_00);
    fVar11 = fVar11 & 0xffffffc0 ^ 0x400000 | uVar20;
  }
  local_60 = CONCAT44(fVar4,fVar7);
  if (fVar11 == (fVar17 & 0x7fffffff)) {
    fVar10 = fVar17;
  }
  if (uVar15 == (uint)local_48) {
    fVar10 = fVar17;
  }
  fVar13 = CONCAT44(fVar10,fVar8);
LAB_0097271a:
  uVar15 = (env->active_tc).msacsr;
  uVar16 = uVar15 >> 7 & 0x1f | 0x20;
  if ((uVar16 & uVar15 >> 0xc) != 0) {
    do_raise_exception(env,unaff_retaddr,(ulong)uVar16);
  }
  (env->active_tc).msacsr = (uVar15 >> 0xc & 0x1f) << 2 | uVar15;
  (env->active_fpu).fpr[wd].fd = local_60;
  *(float64 *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = fVar13;
  return;
}

Assistant:

void helper_msa_fmax_a_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
        uint32_t ws, uint32_t wt)
{
    float_status *status = &env->active_tc.msa_fp_status;
    wr_t wx, *pwx = &wx;
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    clear_msacsr_cause(env);

    if (df == DF_WORD) {
        FMAXMIN_A(max, min, pwx->w[0], pws->w[0], pwt->w[0], 32, status);
        FMAXMIN_A(max, min, pwx->w[1], pws->w[1], pwt->w[1], 32, status);
        FMAXMIN_A(max, min, pwx->w[2], pws->w[2], pwt->w[2], 32, status);
        FMAXMIN_A(max, min, pwx->w[3], pws->w[3], pwt->w[3], 32, status);
    } else if (df == DF_DOUBLE) {
        FMAXMIN_A(max, min, pwx->d[0], pws->d[0], pwt->d[0], 64, status);
        FMAXMIN_A(max, min, pwx->d[1], pws->d[1], pwt->d[1], 64, status);
    } else {
        assert(0);
    }

    check_msacsr_cause(env, GETPC());

    msa_move_v(pwd, pwx);
}